

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O3

int splittingStep_Init(ARKodeMem ark_mem,sunrealtype tout,int init_type)

{
  long *plVar1;
  int iVar2;
  undefined8 in_RAX;
  SplittingStepCoefficients pSVar3;
  long lVar4;
  char *func;
  int iVar5;
  int error_code;
  char *msgfmt;
  uint order;
  
  plVar1 = (long *)ark_mem->step_mem;
  if (plVar1 == (long *)0x0) {
    func = "splittingStep_Init";
    msgfmt = "Time step module memory is NULL.";
    iVar2 = -0x15;
    error_code = -0x15;
    iVar5 = 0x20;
  }
  else {
    if ((ark_mem->interp_type == 0) && (0 < (long)(int)plVar1[3])) {
      lVar4 = 0;
      do {
        if (*(long *)(*(long *)(*(long *)(*plVar1 + lVar4 * 8) + 8) + 0x10) == 0) {
          func = "splittingStep_Init";
          msgfmt = "steppers[%d] must implement SUNStepper_FullRhs when using Hermite interpolation"
          ;
          iVar2 = -0x16;
          error_code = -0x16;
          iVar5 = 0x82;
          goto LAB_0015e0b2;
        }
        lVar4 = lVar4 + 1;
      } while ((int)plVar1[3] != lVar4);
    }
    if (init_type - 1U < 2) {
      return 0;
    }
    if (ark_mem->fixedstep != 0) {
      pSVar3 = (SplittingStepCoefficients)plVar1[1];
      if (pSVar3 == (SplittingStepCoefficients)0x0) {
        order = *(uint *)((long)plVar1 + 0x1c);
        if ((int)order < 2) {
          pSVar3 = SplittingStepCoefficients_LieTrotter((int)plVar1[3]);
        }
        else if (order == 3) {
          pSVar3 = SplittingStepCoefficients_ThirdOrderSuzuki((int)plVar1[3]);
        }
        else {
          if ((order & 1) != 0) {
            order = order + 1;
            arkProcessError(ark_mem,99,0x5a,"splittingStep_SetCoefficients",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                            ,"No splitting method at requested order, using q=%i.",
                            CONCAT44((int)((ulong)in_RAX >> 0x20),order));
          }
          pSVar3 = SplittingStepCoefficients_TripleJump((int)plVar1[3],order);
        }
        plVar1[1] = (long)pSVar3;
        if (pSVar3 == (SplittingStepCoefficients)0x0) {
          func = "splittingStep_SetCoefficients";
          msgfmt = "Failed to allocate splitting coefficients";
          iVar2 = -0x14;
          error_code = -0x14;
          iVar5 = 99;
          goto LAB_0015e0b2;
        }
      }
      iVar5 = pSVar3->order + -1;
      if (ark_mem->interp_degree < pSVar3->order) {
        iVar5 = ark_mem->interp_degree;
      }
      iVar2 = 1;
      if (1 < iVar5) {
        iVar2 = iVar5;
      }
      ark_mem->interp_degree = iVar2;
      return 0;
    }
    func = "splittingStep_Init";
    msgfmt = "Adaptive outer time stepping is not currently supported";
    iVar2 = -0x16;
    error_code = -0x16;
    iVar5 = 0x93;
  }
LAB_0015e0b2:
  arkProcessError(ark_mem,error_code,iVar5,func,
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

static int splittingStep_Init(ARKodeMem ark_mem,
                              SUNDIALS_MAYBE_UNUSED sunrealtype tout,
                              int init_type)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (ark_mem->interp_type == ARK_INTERP_HERMITE)
  {
    for (int i = 0; i < step_mem->partitions; i++)
    {
      if (step_mem->steppers[i]->ops->fullrhs == NULL)
      {
        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                        __FILE__, "steppers[%d] must implement SUNStepper_FullRhs when using Hermite interpolation",
                        i);
        return ARK_ILL_INPUT;
      }
    }
  }

  /* immediately return if resize or reset */
  if (init_type == RESIZE_INIT || init_type == RESET_INIT)
  {
    return ARK_SUCCESS;
  }

  /* assume fixed step size */
  if (!ark_mem->fixedstep)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Adaptive outer time stepping is not currently supported");
    return ARK_ILL_INPUT;
  }

  retval = splittingStep_SetCoefficients(ark_mem, step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  ark_mem->interp_degree =
    SUNMAX(1, SUNMIN(step_mem->coefficients->order - 1, ark_mem->interp_degree));

  return ARK_SUCCESS;
}